

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O2

uint ** Extra_TruthElementary(int nVars)

{
  uint **ppuVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar5 = 1;
  }
  ppuVar1 = (uint **)Extra_ArrayAlloc(nVars,(int)uVar5,4);
  uVar3 = 0;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  uVar4 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    if (uVar3 < 5) {
      for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
        ppuVar1[uVar3][uVar2] = s_VarMasks[uVar3][1];
      }
    }
    else {
      for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
        ppuVar1[uVar3][uVar2] = -(uint)((1 << ((char)uVar3 - 5U & 0x1f) & (uint)uVar2) != 0);
      }
    }
  }
  return ppuVar1;
}

Assistant:

unsigned ** Extra_TruthElementary( int nVars )
{
    unsigned ** pRes;
    int i, k, nWords;
    nWords = Extra_TruthWordNum(nVars);
    pRes = (unsigned **)Extra_ArrayAlloc( nVars, nWords, 4 );
    for ( i = 0; i < nVars; i++ )
    {
        if ( i < 5 )
        {
            for ( k = 0; k < nWords; k++ )
                pRes[i][k] = s_VarMasks[i][1];
        }
        else
        {
            for ( k = 0; k < nWords; k++ )
                if ( k & (1 << (i-5)) )
                    pRes[i][k] = ~(unsigned)0;
                else
                    pRes[i][k] = 0;
        }
    }
    return pRes;
}